

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iostream.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  istream *piVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  string v1;
  string v2;
  ostringstream ss;
  string local_210 [32];
  char *local_1f0;
  long local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  char *local_1d0;
  long local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  char **local_1b0;
  long *local_1a8 [2];
  long local_198 [45];
  
  iVar9 = 15000;
  local_1b0 = argv;
  do {
    plVar3 = (long *)std::istream::putback('\x10');
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error nowide::cin.putback(c) in ",0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                 ,100);
      local_1f0 = (char *)CONCAT71(local_1f0._1_7_,0x3a);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_1f0,1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_1f0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  uVar10 = 14999;
  iVar9 = -15000;
  iVar8 = 0x3ab7;
  do {
    iVar2 = std::istream::get();
    if (iVar8 + (int)(uVar10 / 0x60) * -0x60 != iVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error nowide::cin.get() == c in ",0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                 ,100);
      local_1f0 = (char *)CONCAT71(local_1f0._1_7_,0x3a);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_1f0,1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_1f0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar10 = (ulong)((int)uVar10 - 1);
    iVar8 = iVar8 + -1;
    iVar9 = iVar9 + 1;
  } while (iVar9 != 0);
  local_1f0 = &local_1e0;
  local_1e8 = 0;
  local_1e0 = '\0';
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Normal I/O:",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_238b,0x49)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,anon_var_dwarf_238b,0x49)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Flushing each character:",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  cVar1 = 'B';
  lVar7 = 1;
  do {
    local_1a8[0] = (long *)CONCAT71(local_1a8[0]._1_7_,cVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_1a8,1);
    std::ostream::flush();
    if (((byte)std::runtime_error::runtime_error[*(long *)(std::cout + -0x18)] & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error nowide::cout in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                 ,100);
      local_210[0] = (string)0x3a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_210,1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,local_210);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar1 = anon_var_dwarf_238b[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x4a);
  if ((*(byte *)(*(long *)(std::cerr + -0x18) + 0x106158) & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error nowide::cerr in ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
               ,100);
    local_210[0] = (string)0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210,1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_210);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (argc == 2) {
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-i","");
    iVar9 = std::__cxx11::string::compare((char *)local_1a8);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0],local_198[0] + 1);
    }
    if (iVar9 == 0) {
      piVar4 = std::operator>>((istream *)&std::cin,(string *)&local_1f0);
      std::operator>>(piVar4,(string *)&local_1d0);
      if (((byte)_ITM_registerTMCloneTable[*(long *)(std::cin + -0x18)] & 5) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::cin in ",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                   ,100);
        local_210[0] = (string)0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_210,1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x27);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_210);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"First:  ",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1f0,local_1e8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Second: ",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1d0,local_1c8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (((byte)std::runtime_error::runtime_error[*(long *)(std::cout + -0x18)] & 5) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::cout in ",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                   ,100);
        local_210[0] = (string)0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_210,1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x2a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_210);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc,char **argv)
{
    
    char const *example = "Basic letters: \xd7\xa9-\xd0\xbc-\xce\xbd\n"
                          "East Asian Letters: \xe5\x92\x8c\xe5\xb9\xb3\n"
                          "Non-BMP letters: \xf0\x9d\x84\x9e\n";

    try {
        int maxval = 15000;
        for(int i=0;i<maxval;i++) {
            char c = i % 96 + ' ';
            TEST(nowide::cin.putback(c));
        }
        for(int i=maxval-1;i>=0;i--) {
            int c = i % 96 + ' ';
            TEST(nowide::cin.get() == c);
        }
        std::string v1,v2;
        nowide::cout << "Normal I/O:" << std::endl;
        nowide::cout << example << std::endl;
        nowide::cerr << example << std::endl;
        
        nowide::cout << "Flushing each character:" << std::endl;
        
        for(char const *s=example;*s;s++) {
            nowide::cout << *s << std::flush;
            TEST(nowide::cout);
        }
        
        TEST(nowide::cout);
        TEST(nowide::cerr);
        if(argc==2 && argv[1]==std::string("-i")) {
            nowide::cin  >> v1 >> v2;
            TEST(nowide::cin);
            nowide::cout << "First:  "<< v1 << std::endl;
            nowide::cout << "Second: "<< v2 << std::endl;
            TEST(nowide::cout);
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Fail: " << e.what() << std::endl;
        return 1;
    }
    std::cout <<"Ok" << std::endl;
    return 0;

}